

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpString(TString *s,DumpState *D)

{
  size_t local_28;
  size_t size_1;
  size_t size;
  DumpState *D_local;
  TString *s_local;
  
  size = (size_t)D;
  D_local = (DumpState *)s;
  if (s == (TString *)0x0) {
    size_1 = 0;
    DumpBlock(&size_1,8,D);
  }
  else {
    local_28 = (s->tsv).len + 1;
    DumpBlock(&local_28,8,D);
    DumpBlock(&D_local->strip,local_28,(DumpState *)size);
  }
  return;
}

Assistant:

static void DumpString(const TString* s, DumpState* D)
{
 if (s==NULL)
 {
  size_t size=0;
  DumpVar(size,D);
 }
 else
 {
  size_t size=s->tsv.len+1;		/* include trailing '\0' */
  DumpVar(size,D);
  DumpBlock(getstr(s),size*sizeof(char),D);
 }
}